

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O1

void pd_defaultsymbol(t_pd *x,t_symbol *s)

{
  t_listmethod p_Var1;
  t_atom at;
  t_atom local_10;
  
  p_Var1 = (*x)->c_listmethod;
  local_10.a_w.w_symbol = s;
  if (p_Var1 == pd_defaultlist) {
    local_10.a_type = A_SYMBOL;
    (*(*x)->c_anymethod)(x,&s_symbol,1,&local_10);
  }
  else {
    local_10.a_type = A_SYMBOL;
    (*p_Var1)(x,(t_symbol *)0x0,1,&local_10);
  }
  return;
}

Assistant:

static void pd_defaultsymbol(t_pd *x, t_symbol *s)
{
    if (*(*x)->c_listmethod != pd_defaultlist)
    {
        t_atom at;
        SETSYMBOL(&at, s);
        (*(*x)->c_listmethod)(x, 0, 1, &at);
    }
    else
    {
        t_atom at;
        SETSYMBOL(&at, s);
        (*(*x)->c_anymethod)(x, &s_symbol, 1, &at);
    }
}